

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O1

void __thiscall
rtosc::ThreadLink::ThreadLink(ThreadLink *this,size_t max_message_length,size_t max_messages)

{
  char *pcVar1;
  internal_ringbuffer_t *piVar2;
  ulong uVar3;
  
  this->MaxMsg = max_message_length;
  uVar3 = max_messages * max_message_length;
  this->BufferSize = uVar3;
  pcVar1 = (char *)operator_new__(max_message_length);
  this->write_buffer = pcVar1;
  pcVar1 = (char *)operator_new__(max_message_length);
  this->read_buffer = pcVar1;
  piVar2 = (internal_ringbuffer_t *)operator_new(0x28);
  this->ring = piVar2;
  pcVar1 = (char *)operator_new__(uVar3);
  piVar2->buffer = pcVar1;
  piVar2->size = uVar3;
  LOCK();
  (piVar2->read).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->ring->read_lookahead).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->ring->write).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  memset(this->write_buffer,0,this->MaxMsg);
  memset(this->read_buffer,0,this->MaxMsg);
  return;
}

Assistant:

ThreadLink::ThreadLink(size_t max_message_length, size_t max_messages)
    :MaxMsg(max_message_length),
    BufferSize(MaxMsg*max_messages),
    write_buffer(new char[MaxMsg]),
    read_buffer(new char[MaxMsg]),
    ring(new ringbuffer_t)
{
    ring->buffer         = new char[BufferSize];
    ring->size           = BufferSize;
    ring->read           = 0;
    ring->read_lookahead = 0;
    ring->write          = 0;
    memset(write_buffer, 0, MaxMsg);
    memset(read_buffer, 0, MaxMsg);
}